

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O1

bool SetUserDefinedDevice(char *id,CDevice **dev,CDevice *parent,aint ramtop)

{
  CDeviceDef *pCVar1;
  pointer ppCVar2;
  int iVar3;
  CDevice *device;
  char *pcVar4;
  long lVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  
  ppCVar2 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar5 = (long)DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 5;
  ppCVar6 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < lVar5) {
    ppCVar6 = (pointer)(((long)DefDevices.
                               super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)DefDevices.
                               super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>.
                               _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffe0U) +
                       (long)DefDevices.
                             super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl
                             .super__Vector_impl_data._M_start);
    lVar5 = lVar5 + 1;
    ppCVar7 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
              super__Vector_impl_data._M_start + 2;
    do {
      iVar3 = strcasecmp(id,ppCVar7[-2]->ID);
      if (iVar3 == 0) {
        ppCVar7 = ppCVar7 + -2;
        goto LAB_0010b688;
      }
      iVar3 = strcasecmp(id,ppCVar7[-1]->ID);
      if (iVar3 == 0) {
        ppCVar7 = ppCVar7 + -1;
        goto LAB_0010b688;
      }
      iVar3 = strcasecmp(id,(*ppCVar7)->ID);
      if (iVar3 == 0) goto LAB_0010b688;
      iVar3 = strcasecmp(id,ppCVar7[1]->ID);
      if (iVar3 == 0) {
        ppCVar7 = ppCVar7 + 1;
        goto LAB_0010b688;
      }
      lVar5 = lVar5 + -1;
      ppCVar7 = ppCVar7 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)ppCVar2 - (long)ppCVar6 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      ppCVar7 = ppCVar2;
      if ((lVar5 != 3) || (iVar3 = strcasecmp(id,(*ppCVar6)->ID), ppCVar7 = ppCVar6, iVar3 == 0))
      goto LAB_0010b688;
      ppCVar6 = ppCVar6 + 1;
    }
    iVar3 = strcasecmp(id,(*ppCVar6)->ID);
    ppCVar7 = ppCVar6;
    if (iVar3 == 0) goto LAB_0010b688;
    ppCVar6 = ppCVar6 + 1;
  }
  iVar3 = strcasecmp(id,(*ppCVar6)->ID);
  ppCVar7 = ppCVar6;
  if (iVar3 != 0) {
    ppCVar7 = ppCVar2;
  }
LAB_0010b688:
  if (ppCVar2 != ppCVar7) {
    pCVar1 = *ppCVar7;
    if (ramtop != 0) {
      WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
    }
    device = (CDevice *)operator_new(0x2838);
    pcVar4 = pCVar1->ID;
    device->Next = (CDevice *)0x0;
    device->SlotsCount = 0;
    device->PagesCount = 0;
    device->Memory = (byte *)0x0;
    device->ZxRamTop = 0;
    device->CurrentSlot = 0;
    device->limitExceeded = false;
    device->previousSlotI = 0;
    device->previousSlotOpt = O_NONE;
    pcVar4 = strdup(pcVar4);
    device->ID = pcVar4;
    if (parent != (CDevice *)0x0) {
      parent->Next = device;
    }
    memset(device->Slots,0,0x2800);
    *dev = device;
    initRegularSlotDevice
              (device,pCVar1->SlotSize,pCVar1->SlotsCount,pCVar1->PagesCount,pCVar1->initialPages);
  }
  return ppCVar2 != ppCVar7;
}

Assistant:

static bool SetUserDefinedDevice(const char* id, CDevice** dev, CDevice* parent, aint ramtop) {
	auto findIt = std::find_if(
		DefDevices.begin(), DefDevices.end(),
		[&](const CDeviceDef* el) { return 0 == strcasecmp(id, el->getID()); }
	);
	if (DefDevices.end() == findIt) return false;	// not found
	const CDeviceDef & def = **findIt;
	if (ramtop) WarningById(W_NO_RAMTOP);
	*dev = new CDevice(def.getID(), parent);
	initRegularSlotDevice(*dev, def.SlotSize, def.SlotsCount, def.PagesCount, def.initialPages);
	return true;
}